

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::decomposeGeometryMethods
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped **node,TIntermNode *arguments)

{
  int iVar1;
  undefined4 extraout_var;
  TIntermOperator *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  const_reference ppTVar2;
  undefined4 extraout_var_02;
  TIntermAggregate *pTVar3;
  TIntermAggregate *local_250;
  TType local_240;
  TIntermAggregate *local_1a8;
  TIntermAggregate *cut;
  TIntermTyped *local_198;
  TIntermTyped *local_190;
  TIntermTyped *local_188;
  TType local_180;
  TIntermNode *local_e8;
  TIntermTyped *data;
  TIntermAggregate *local_48;
  TIntermAggregate *emit;
  TIntermAggregate *sequence;
  TIntermAggregate *argAggregate;
  TIntermNode *pTStack_28;
  TOperator op;
  TIntermNode *arguments_local;
  TIntermTyped **node_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if ((*node != (TIntermTyped *)0x0) &&
     (pTStack_28 = arguments, arguments_local = (TIntermNode *)node,
     node_local = (TIntermTyped **)loc, loc_local = (TSourceLoc *)this,
     iVar1 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[4])(),
     CONCAT44(extraout_var,iVar1) != 0)) {
    this_00 = (TIntermOperator *)(**(code **)(*arguments_local->_vptr_TIntermNode + 0x20))();
    argAggregate._4_4_ = TIntermOperator::getOp(this_00);
    if (pTStack_28 == (TIntermNode *)0x0) {
      local_250 = (TIntermAggregate *)0x0;
    }
    else {
      iVar1 = (*pTStack_28->_vptr_TIntermNode[6])();
      local_250 = (TIntermAggregate *)CONCAT44(extraout_var_00,iVar1);
    }
    sequence = local_250;
    if (argAggregate._4_4_ == EOpMethodAppend) {
      if (local_250 != (TIntermAggregate *)0x0) {
        if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
          emit = (TIntermAggregate *)0x0;
          pTVar3 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)loc);
          TIntermAggregate::TIntermAggregate(pTVar3,EOpEmitVertex);
          local_48 = pTVar3;
          (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [1])(pTVar3,node_local);
          pTVar3 = local_48;
          TType::TType((TType *)&data,EbtVoid,EvqTemporary,1,0,0,false);
          (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar3,&data);
          TType::~TType((TType *)&data);
          iVar1 = (*(sequence->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x33])();
          ppTVar2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::operator[]
                              ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                               CONCAT44(extraout_var_01,iVar1),1);
          iVar1 = (*(*ppTVar2)->_vptr_TIntermNode[3])();
          local_e8 = (TIntermNode *)CONCAT44(extraout_var_02,iVar1);
          emit = TIntermediate::growAggregate
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            (TIntermNode *)emit,local_e8,(TSourceLoc *)node_local);
          emit = TIntermediate::growAggregate
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            (TIntermNode *)emit,(TIntermNode *)local_48);
          (*(emit->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x31])(emit,1);
          (*(emit->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                    (emit,node_local);
          pTVar3 = emit;
          TType::TType(&local_180,EbtVoid,EvqTemporary,1,0,0,false);
          (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar3,&local_180);
          TType::~TType(&local_180);
          cut = emit;
          local_198 = *node_local;
          local_190 = node_local[1];
          local_188 = node_local[2];
          std::
          vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
          ::push_back(&(this->gsAppends).
                       super_vector<glslang::HlslParseContext::tGsAppendData,_glslang::pool_allocator<glslang::HlslParseContext::tGsAppendData>_>
                      ,(value_type *)&cut);
          arguments_local->_vptr_TIntermNode = (_func_int **)emit;
        }
        else {
          arguments_local->_vptr_TIntermNode = (_func_int **)0x0;
        }
      }
    }
    else if (argAggregate._4_4_ == EOpMethodRestartStrip) {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
        pTVar3 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)loc);
        TIntermAggregate::TIntermAggregate(pTVar3,EOpEndPrimitive);
        local_1a8 = pTVar3;
        (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                  (pTVar3,node_local);
        pTVar3 = local_1a8;
        TType::TType(&local_240,EbtVoid,EvqTemporary,1,0,0,false);
        (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
          [0x1d])(pTVar3,&local_240);
        TType::~TType(&local_240);
        arguments_local->_vptr_TIntermNode = (_func_int **)local_1a8;
      }
      else {
        arguments_local->_vptr_TIntermNode = (_func_int **)0x0;
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::decomposeGeometryMethods(const TSourceLoc& loc, TIntermTyped*& node, TIntermNode* arguments)
{
    if (node == nullptr || !node->getAsOperator())
        return;

    const TOperator op  = node->getAsOperator()->getOp();
    const TIntermAggregate* argAggregate = arguments ? arguments->getAsAggregate() : nullptr;

    switch (op) {
    case EOpMethodAppend:
        if (argAggregate) {
            // Don't emit these for non-GS stage, since we won't have the gsStreamOutput symbol.
            if (language != EShLangGeometry) {
                node = nullptr;
                return;
            }

            TIntermAggregate* sequence = nullptr;
            TIntermAggregate* emit = new TIntermAggregate(EOpEmitVertex);

            emit->setLoc(loc);
            emit->setType(TType(EbtVoid));

            TIntermTyped* data = argAggregate->getSequence()[1]->getAsTyped();

            // This will be patched in finalization during finalizeAppendMethods()
            sequence = intermediate.growAggregate(sequence, data, loc);
            sequence = intermediate.growAggregate(sequence, emit);

            sequence->setOperator(EOpSequence);
            sequence->setLoc(loc);
            sequence->setType(TType(EbtVoid));

            gsAppends.push_back({sequence, loc});

            node = sequence;
        }
        break;

    case EOpMethodRestartStrip:
        {
            // Don't emit these for non-GS stage, since we won't have the gsStreamOutput symbol.
            if (language != EShLangGeometry) {
                node = nullptr;
                return;
            }

            TIntermAggregate* cut = new TIntermAggregate(EOpEndPrimitive);
            cut->setLoc(loc);
            cut->setType(TType(EbtVoid));
            node = cut;
        }
        break;

    default:
        break; // most pass through unchanged
    }
}